

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool anon_unknown.dwarf_12932::SolverDpllTriadSimd<0>::InitVanillaByBand(char *input,State *state)

{
  bool bVar1;
  uint32_t uVar2;
  uint nonzero_x;
  uint64_t uVar3;
  long in_RDI;
  int cell_idx_1;
  uint32_t clues16;
  int cell_idx;
  uint64_t clues64;
  int in_stack_0000006c;
  State *in_stack_00000070;
  char *in_stack_00000078;
  int in_stack_000002c8;
  int in_stack_000002cc;
  State *in_stack_000002d0;
  undefined1 local_25;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 local_18;
  
  uVar3 = WhichDots64((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (local_18 = uVar3 ^ 0xffffffffffffffff; local_18 != 0; local_18 = ClearLowBit64(local_18)) {
    LowOrderBitIndex64(local_18);
    InitClue(in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  }
  uVar2 = WhichDots16((char *)(in_RDI + 0x40));
  for (nonzero_x = uVar2 ^ 0xffff; nonzero_x != 0; nonzero_x = ClearLowBit(nonzero_x)) {
    LowOrderBitIndex(nonzero_x);
    InitClue(in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  }
  if (*(char *)(in_RDI + 0x50) != '.') {
    InitClue(in_stack_00000078,in_stack_00000070,in_stack_0000006c);
  }
  bVar1 = BandEliminate<0>(in_stack_000002d0,in_stack_000002cc,in_stack_000002c8);
  local_25 = false;
  if (bVar1) {
    bVar1 = BandEliminate<1>(in_stack_000002d0,in_stack_000002cc,in_stack_000002c8);
    local_25 = false;
    if (bVar1) {
      bVar1 = BandEliminate<0>(in_stack_000002d0,in_stack_000002cc,in_stack_000002c8);
      local_25 = false;
      if (bVar1) {
        bVar1 = BandEliminate<1>(in_stack_000002d0,in_stack_000002cc,in_stack_000002c8);
        local_25 = false;
        if (bVar1) {
          bVar1 = BandEliminate<0>(in_stack_000002d0,in_stack_000002cc,in_stack_000002c8);
          local_25 = false;
          if (bVar1) {
            local_25 = BandEliminate<1>(in_stack_000002d0,in_stack_000002cc,in_stack_000002c8);
          }
        }
      }
    }
  }
  return local_25;
}

Assistant:

static bool InitVanillaByBand(const char *input, State &state) {
        uint64_t clues64 = WhichDots64(input) ^ (uint64_t)-1ll;
        while (clues64) {
            int cell_idx = LowOrderBitIndex64(clues64);
            InitClue(input, state, cell_idx);
            clues64 = ClearLowBit64(clues64);
        }
        uint32_t clues16 = WhichDots16(input + 64) ^ 0xffffu;
        while (clues16) {
            int cell_idx = 64 + LowOrderBitIndex(clues16);
            InitClue(input, state, cell_idx);
            clues16 = ClearLowBit(clues16);
        }
        if (input[80] != '.') {
            InitClue(input, state, 80);
        }
        // thanks to the merging of band updates the puzzle is almost always fully initialized
        // after the first of these calls. most will be no-ops, but we've still got to do them
        // since this cannot be guaranteed.
        return BandEliminate<0>(state, 0, 1) && BandEliminate<1>(state, 0, 1) &&
               BandEliminate<0>(state, 1, 2) && BandEliminate<1>(state, 1, 2) &&
               BandEliminate<0>(state, 2, 0) && BandEliminate<1>(state, 2, 0);
    }